

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delaunay.c
# Opt level: O0

void resetDelaunayTriangulation(DelaunayTriangulation *delTri)

{
  Edge *pEVar1;
  double dVar2;
  DelaunayTriangulation *delTri_local;
  
  if (delTri->edges != (Edge *)0x0) {
    free(delTri->edges);
  }
  if (delTri->n_points == 0) {
    delTri->n_edges_max = 0;
  }
  else {
    dVar2 = log((double)delTri->n_points);
    dVar2 = ceil(dVar2 * 3.0 * (double)delTri->n_points);
    delTri->n_edges_max = (int)dVar2;
  }
  delTri->n_edges = 0;
  delTri->n_edges_discarded = 0;
  pEVar1 = (Edge *)malloc((long)delTri->n_edges_max * 0x28);
  delTri->edges = pEVar1;
  if ((delTri->edges == (Edge *)0x0) && (1 < delTri->n_points)) {
    printf("ERROR: Couldn\'t allocate memory for edges\n");
    free(delTri);
    exit(1);
  }
  delTri->success = 0;
  return;
}

Assistant:

void resetDelaunayTriangulation(DelaunayTriangulation *delTri) {
	if (delTri->edges != NULL) {
		free(delTri->edges);
	}

	// (Half) Edges
	if (delTri->n_points == 0) {
		delTri->n_edges_max = 0;
	}
	else {
		delTri->n_edges_max = (GLsizei) ceil((log(delTri->n_points) * 3 * delTri->n_points));
	}

	delTri->n_edges = 0;
	delTri->n_edges_discarded = 0;
	delTri->edges = malloc(sizeof(Edge) * delTri->n_edges_max);

	if ((delTri->edges == NULL) && (delTri->n_points > 1)) {
		printf("ERROR: Couldn't allocate memory for edges\n");
		free(delTri);
		exit(1);
	}

	delTri->success = 0;
}